

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_storage.cpp
# Opt level: O1

int __thiscall
libtorrent::dht::anon_unknown_0::dht_default_storage::get_infohashes_sample
          (dht_default_storage *this,entry *item)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_node_base *__args;
  pointer *ppdVar2;
  pointer pdVar3;
  iterator __position;
  pointer pdVar4;
  uint uVar5;
  _Base_ptr p_Var6;
  size_t sVar7;
  undefined4 uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  entry *peVar12;
  time_point tVar13;
  long lVar14;
  _Base_ptr p_Var15;
  int iVar16;
  ulong i;
  string_view key;
  string_view key_00;
  string_view key_01;
  span<const_char> str;
  
  uVar9 = (*this->m_settings->_vptr_settings_interface[5])(this->m_settings,0x4093);
  if (0x545f < (int)uVar9) {
    uVar9 = 0x5460;
  }
  i = (ulong)uVar9;
  if ((int)uVar9 < 1) {
    i = 0;
  }
  key._M_str = "interval";
  key._M_len = 8;
  peVar12 = entry::operator[](item,key);
  entry::operator=(peVar12,i);
  sVar7 = (this->m_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  key_00._M_str = "num";
  key_00._M_len = 3;
  peVar12 = entry::operator[](item,key_00);
  entry::operator=(peVar12,(long)(int)sVar7);
  tVar13 = aux::time_now();
  uVar10 = (*this->m_settings->_vptr_settings_interface[5])(this->m_settings,0x4093);
  uVar11 = (*this->m_settings->_vptr_settings_interface[5])(this->m_settings,0x4094);
  uVar9 = 0x14;
  if ((int)uVar11 < 0x14) {
    uVar9 = uVar11;
  }
  if ((int)uVar9 < 1) {
    uVar9 = 0;
  }
  uVar11 = (uint)(this->m_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if ((int)uVar9 < (int)uVar11) {
    uVar11 = uVar9;
  }
  if (0 < (int)uVar10) {
    uVar5 = 0x5460;
    if ((int)uVar10 < 0x5460) {
      uVar5 = uVar10;
    }
    if (((long)tVar13.__d.__r <
         (long)((ulong)uVar5 * 1000000000 + (this->m_infohashes_sample).created.__d.__r)) &&
       ((int)uVar9 <=
        (int)((ulong)((long)(this->m_infohashes_sample).samples.
                            super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                            .
                            super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->m_infohashes_sample).samples.
                           super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                           .
                           super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x33333333))
    goto LAB_003b8b47;
  }
  pdVar3 = (this->m_infohashes_sample).samples.
           super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
           super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_infohashes_sample).samples.
      super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
      super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != pdVar3) {
    (this->m_infohashes_sample).samples.
    super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
    super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = pdVar3;
  }
  ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::reserve
            ((vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> *)
             &this->m_infohashes_sample,(long)(int)uVar11);
  p_Var15 = (this->m_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->m_map)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var15 != p_Var1) {
    uVar9 = (uint)(this->m_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    do {
      if (uVar11 == 0) {
        iVar16 = 2;
        uVar11 = 0;
      }
      else {
        uVar10 = uVar9 - 1;
        lVar14 = aux::random((aux *)(ulong)uVar9);
        iVar16 = 3;
        uVar9 = uVar10;
        if ((uint)lVar14 <= uVar11) {
          __args = p_Var15 + 1;
          __position._M_current =
               (this->m_infohashes_sample).samples.
               super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
               .
               super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->m_infohashes_sample).samples.
              super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
              .
              super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<libtorrent::digest32<160l>,std::allocator<libtorrent::digest32<160l>>>::
            _M_realloc_insert<libtorrent::digest32<160l>const&>
                      ((vector<libtorrent::digest32<160l>,std::allocator<libtorrent::digest32<160l>>>
                        *)&this->m_infohashes_sample,__position,(digest32<160L> *)__args);
          }
          else {
            ((__position._M_current)->m_number)._M_elems[4] = *(uint *)&p_Var15[1]._M_left;
            uVar8 = *(undefined4 *)&__args->field_0x4;
            p_Var6 = p_Var15[1]._M_parent;
            ((__position._M_current)->m_number)._M_elems[0] = __args->_M_color;
            ((__position._M_current)->m_number)._M_elems[1] = uVar8;
            *(_Base_ptr *)(((__position._M_current)->m_number)._M_elems + 2) = p_Var6;
            ppdVar2 = &(this->m_infohashes_sample).samples.
                       super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                       .
                       super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppdVar2 = *ppdVar2 + 1;
          }
          uVar11 = uVar11 - 1;
          iVar16 = 0;
        }
      }
    } while (((iVar16 == 3) || (iVar16 == 0)) &&
            (p_Var15 = (_Base_ptr)::std::_Rb_tree_increment(p_Var15),
            (_Rb_tree_header *)p_Var15 != p_Var1));
  }
  (this->m_infohashes_sample).created.__d.__r = (rep)tVar13.__d.__r;
LAB_003b8b47:
  pdVar3 = (this->m_infohashes_sample).samples.
           super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
           super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pdVar4 = (this->m_infohashes_sample).samples.
           super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
           super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  key_01._M_str = "samples";
  key_01._M_len = 7;
  peVar12 = entry::operator[](item,key_01);
  str.m_len = (long)pdVar4 - (long)pdVar3;
  str.m_ptr = (char *)pdVar3;
  entry::operator=(peVar12,str);
  return (int)((ulong)((long)(this->m_infohashes_sample).samples.
                             super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                             .
                             super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_infohashes_sample).samples.
                            super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                            .
                            super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x33333333;
}

Assistant:

int get_infohashes_sample(entry& item) override
		{
			item["interval"] = std::clamp(m_settings.get_int(settings_pack::dht_sample_infohashes_interval)
				, 0, sample_infohashes_interval_max);
			item["num"] = int(m_map.size());

			refresh_infohashes_sample();

			aux::vector<sha1_hash> const& samples = m_infohashes_sample.samples;
			item["samples"] = span<char const>(
				reinterpret_cast<char const*>(samples.data()), static_cast<std::ptrdiff_t>(samples.size()) * 20);

			return m_infohashes_sample.count();
		}